

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

CodeLocation __thiscall
soul::SimpleTokeniser::findNext(SimpleTokeniser *this,CodeLocation *start,TokenType target)

{
  bool bVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar2;
  CodeLocation CVar3;
  SimpleTokeniser tokeniser;
  
  SimpleTokeniser(&tokeniser,start,true);
  do {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&tokeniser.super_SOULTokeniser,(TokenType)0x29b6f4);
    if (bVar1) {
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::~Tokeniser(&tokeniser.super_SOULTokeniser);
      (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
      (this->super_SOULTokeniser).startLocation.sourceCode.object = (SourceCodeText *)0x0;
      UVar2.data = extraout_RDX;
LAB_001f95b3:
      CVar3.location.data = UVar2.data;
      CVar3.sourceCode.object = (SourceCodeText *)this;
      return CVar3;
    }
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&tokeniser.super_SOULTokeniser,target);
    if (bVar1) {
      (this->super_SOULTokeniser)._vptr_Tokeniser =
           (_func_int **)tokeniser.super_SOULTokeniser.location.sourceCode.object;
      if (tokeniser.super_SOULTokeniser.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((tokeniser.super_SOULTokeniser.location.sourceCode.object)->super_RefCountedObject).
        refCount = ((tokeniser.super_SOULTokeniser.location.sourceCode.object)->
                   super_RefCountedObject).refCount + 1;
      }
      (this->super_SOULTokeniser).startLocation.sourceCode.object =
           (SourceCodeText *)tokeniser.super_SOULTokeniser.location.location.data;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::~Tokeniser(&tokeniser.super_SOULTokeniser);
      UVar2.data = extraout_RDX_00;
      goto LAB_001f95b3;
    }
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&tokeniser.super_SOULTokeniser);
  } while( true );
}

Assistant:

static CodeLocation findNext (CodeLocation start, TokenType target)
    {
        try
        {
            SimpleTokeniser tokeniser (start, true);

            while (! tokeniser.matches (Token::eof))
            {
                if (tokeniser.matches (target))
                    return tokeniser.location;

                tokeniser.skip();
            }
        }
        catch (const AbortCompilationException&) {}

        return {};
    }